

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper * __thiscall
Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
          (JavascriptLibrary *this,ScriptContext *ctx,uint32 value)

{
  Recycler *alloc;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])
             &JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1615;
  alloc = Memory::Recycler::TrackAllocInfo(ctx->recycler,(TrackAllocData *)local_38);
  pJVar1 = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
           new<Memory::Recycler>(4,alloc,0x51e21e);
  pJVar1->remainingElements = value;
  return pJVar1;
}

Assistant:

JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* JavascriptLibrary::CreateRemainingElementsWrapper_TTD(Js::ScriptContext* ctx, uint32 value)
    {
        JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(ctx->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
        remainingElementsWrapper->remainingElements = value;

        return remainingElementsWrapper;
    }